

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O0

void Omega_h::grade_fix_adapt(Mesh *mesh,AdaptOpts *opts,Reals *target_metric,bool verbose)

{
  AdaptOpts *pAVar1;
  bool bVar2;
  LO nmetrics;
  Int IVar3;
  int iVar4;
  ostream *poVar5;
  Real RVar6;
  bool local_105;
  Omega_h_Isotropy isotropy;
  Real min_qual;
  string local_f0 [32];
  Read<double> local_d0;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  Read<double> local_70;
  Read<double> local_60 [2];
  Read<double> local_40;
  Int local_30;
  bool local_29;
  Int metric_dim;
  bool verbose_local;
  Reals *target_metric_local;
  AdaptOpts *opts_local;
  Mesh *mesh_local;
  
  local_105 = false;
  _metric_dim = target_metric;
  target_metric_local = (Reals *)opts;
  opts_local = (AdaptOpts *)mesh;
  if (verbose) {
    local_29 = verbose;
    local_105 = can_print(mesh);
  }
  local_29 = local_105;
  nmetrics = Mesh::nverts((Mesh *)opts_local);
  Read<double>::Read(&local_40,target_metric);
  IVar3 = get_metrics_dim(nmetrics,&local_40);
  Read<double>::~Read(&local_40);
  local_30 = IVar3;
  if ((local_29 & 1U) != 0) {
    std::operator<<((ostream *)&std::cout,"Limiting target metric gradation...\n");
  }
  pAVar1 = opts_local;
  Read<double>::Read(&local_70,target_metric);
  limit_metric_gradation((Omega_h *)local_60,(Mesh *)pAVar1,&local_70,0.5,0.01,true);
  Read<double>::operator=(target_metric,local_60);
  Read<double>::~Read(local_60);
  Read<double>::~Read(&local_70);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"target_metric",&local_91);
  Mesh::remove_tag((Mesh *)pAVar1,0,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"target_metric",&local_b9);
  mesh_local._4_4_ = local_30;
  iVar4 = (local_30 + 1) * local_30;
  Read<double>::Read(&local_d0,target_metric);
  Mesh::add_tag<double>((Mesh *)pAVar1,0,(string *)local_b8,iVar4 / 2,&local_d0,false);
  Read<double>::~Read(&local_d0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"metric",(allocator *)((long)&min_qual + 7));
  bVar2 = Mesh::has_tag((Mesh *)pAVar1,0,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&min_qual + 7));
  if (bVar2) {
    if ((local_29 & 1U) != 0) {
      std::operator<<((ostream *)&std::cout,
                      "Mesh already has \"metric\" on vertices, assuming that is current\n");
    }
  }
  else {
    if ((local_29 & 1U) != 0) {
      std::operator<<((ostream *)&std::cout,"Deriving implied metric...\n");
    }
    if (local_30 == 1) {
      add_implied_isos_tag((Mesh *)opts_local);
    }
    else {
      add_implied_metric_tag((Mesh *)opts_local);
    }
  }
  RVar6 = Mesh::min_quality((Mesh *)opts_local);
  if ((local_29 & 1U) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Initial mesh has minimum quality ");
    std::ostream::operator<<(poVar5,RVar6);
  }
  if ((double)target_metric_local[1].write_.shared_alloc_.direct_ptr <= RVar6) {
    if ((local_29 & 1U) != 0) {
      std::operator<<((ostream *)&std::cout,", which is good\n");
    }
  }
  else {
    if ((local_29 & 1U) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout," < minimum acceptable quality ");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(double)target_metric_local[1].write_.shared_alloc_.direct_ptr);
      std::operator<<(poVar5,'\n');
      std::operator<<((ostream *)&std::cout,
                      "Omega_h will now attempt to repair the initial mesh quality.\n");
      std::operator<<((ostream *)&std::cout,"This could take some time...\n");
    }
    fix((Mesh *)opts_local,(AdaptOpts *)target_metric_local,(uint)(local_30 == 1),true);
    if ((local_29 & 1U) != 0) {
      std::operator<<((ostream *)&std::cout,"\nOmega_h is done repairing mesh quality!\n\n");
    }
  }
  if ((local_29 & 1U) != 0) {
    std::operator<<((ostream *)&std::cout,"Adapting...\n");
  }
  while (bVar2 = approach_metric((Mesh *)opts_local,(AdaptOpts *)target_metric_local,0.0001), bVar2)
  {
    adapt((Mesh *)opts_local,(AdaptOpts *)target_metric_local);
  }
  if ((local_29 & 1U) != 0) {
    std::operator<<((ostream *)&std::cout,"\nDone adapting!\n\n");
  }
  return;
}

Assistant:

void grade_fix_adapt(
    Mesh* mesh, AdaptOpts const& opts, Reals target_metric, bool verbose) {
  verbose = verbose && can_print(mesh);
  auto metric_dim = get_metrics_dim(mesh->nverts(), target_metric);
  if (verbose) std::cout << "Limiting target metric gradation...\n";
  target_metric = Omega_h::limit_metric_gradation(mesh, target_metric, 0.5);
  mesh->remove_tag(VERT, "target_metric");
  mesh->add_tag(VERT, "target_metric", symm_ncomps(metric_dim), target_metric);
  if (mesh->has_tag(0, "metric")) {
    if (verbose)
      std::cout << "Mesh already has \"metric\" on vertices, assuming that is "
                   "current\n";
  } else {
    if (verbose) std::cout << "Deriving implied metric...\n";
    if (metric_dim == 1) {
      Omega_h::add_implied_isos_tag(mesh);
    } else {
      Omega_h::add_implied_metric_tag(mesh);
    }
  }
  auto min_qual = mesh->min_quality();
  if (verbose) std::cout << "Initial mesh has minimum quality " << min_qual;
  if (min_qual < opts.min_quality_allowed) {
    if (verbose) {
      std::cout << " < minimum acceptable quality " << opts.min_quality_allowed
                << '\n';
      std::cout
          << "Omega_h will now attempt to repair the initial mesh quality.\n";
      std::cout << "This could take some time...\n";
    }
    auto isotropy =
        (metric_dim == 1 ? OMEGA_H_ISO_LENGTH : OMEGA_H_ANISOTROPIC);
    Omega_h::fix(mesh, opts, isotropy, /*verbose=*/true);
    if (verbose) std::cout << "\nOmega_h is done repairing mesh quality!\n\n";
  } else {
    if (verbose) std::cout << ", which is good\n";
  }
  if (verbose) std::cout << "Adapting...\n";
  while (Omega_h::approach_metric(mesh, opts)) {
    Omega_h::adapt(mesh, opts);
  }
  if (verbose) std::cout << "\nDone adapting!\n\n";
}